

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::setCharAt(UnicodeString *this,int32_t offset,UChar c)

{
  UBool UVar1;
  int32_t iVar2;
  char16_t *pcVar3;
  int32_t len;
  UChar c_local;
  int32_t offset_local;
  UnicodeString *this_local;
  
  iVar2 = length(this);
  UVar1 = cloneArrayIfNeeded(this,-1,-1,'\x01',(int32_t **)0x0,'\0');
  if ((UVar1 != '\0') && (0 < iVar2)) {
    if (offset < 0) {
      len = 0;
    }
    else {
      len = offset;
      if (iVar2 <= offset) {
        len = iVar2 + -1;
      }
    }
    pcVar3 = getArrayStart(this);
    pcVar3[len] = c;
  }
  return this;
}

Assistant:

UnicodeString&
UnicodeString::setCharAt(int32_t offset,
             UChar c)
{
  int32_t len = length();
  if(cloneArrayIfNeeded() && len > 0) {
    if(offset < 0) {
      offset = 0;
    } else if(offset >= len) {
      offset = len - 1;
    }

    getArrayStart()[offset] = c;
  }
  return *this;
}